

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextFilter::ImGuiTextFilter(ImGuiTextFilter *this,char *default_filter)

{
  char *default_filter_local;
  ImGuiTextFilter *this_local;
  
  ImVector<ImGuiTextFilter::TextRange>::ImVector(&this->Filters);
  if (default_filter == (char *)0x0) {
    this->InputBuf[0] = '\0';
    this->CountGrep = 0;
  }
  else {
    ImStrncpy(this->InputBuf,default_filter,0x100);
    Build(this);
  }
  return;
}

Assistant:

ImGuiTextFilter::ImGuiTextFilter(const char* default_filter)
{
    if (default_filter)
    {
        ImStrncpy(InputBuf, default_filter, IM_ARRAYSIZE(InputBuf));
        Build();
    }
    else
    {
        InputBuf[0] = 0;
        CountGrep = 0;
    }
}